

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O3

void __thiscall
sglr::rc::VertexArray::VertexArray(VertexArray *this,deUint32 name,int maxVertexAttribs)

{
  undefined8 *puVar1;
  pointer pVVar2;
  long lVar3;
  allocator_type local_19;
  
  (this->super_NamedObject).m_name = name;
  (this->super_NamedObject).m_refCount = 1;
  (this->super_NamedObject)._vptr_NamedObject = (_func_int **)&PTR__VertexArray_00784dd8;
  this->m_elementArrayBufferBinding = (DataBuffer *)0x0;
  std::
  vector<sglr::rc::VertexArray::VertexAttribArray,_std::allocator<sglr::rc::VertexArray::VertexAttribArray>_>
  ::vector(&this->m_arrays,(long)maxVertexAttribs,&local_19);
  if (0 < maxVertexAttribs) {
    pVVar2 = (this->m_arrays).
             super__Vector_base<sglr::rc::VertexArray::VertexAttribArray,_std::allocator<sglr::rc::VertexArray::VertexAttribArray>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar3 = 0;
    do {
      (&pVVar2->enabled)[lVar3] = false;
      *(undefined8 *)((long)&pVVar2->size + lVar3) = 4;
      *(undefined4 *)((long)&pVVar2->type + lVar3) = 0x1406;
      *(undefined2 *)(&pVVar2->normalized + lVar3) = 0;
      *(undefined4 *)((long)&pVVar2->divisor + lVar3) = 0;
      (&pVVar2->bufferDeleted)[lVar3] = false;
      puVar1 = (undefined8 *)((long)&pVVar2->bufferBinding + lVar3);
      *puVar1 = 0;
      puVar1[1] = 0;
      lVar3 = lVar3 + 0x30;
    } while ((ulong)(uint)maxVertexAttribs * 0x30 != lVar3);
  }
  return;
}

Assistant:

VertexArray::VertexArray (deUint32 name, int maxVertexAttribs)
	: NamedObject					(name)
	, m_elementArrayBufferBinding	(DE_NULL)
	, m_arrays						(maxVertexAttribs)
{
	for (int i = 0; i < maxVertexAttribs; ++i)
	{
		m_arrays[i].enabled			= false;
		m_arrays[i].size			= 4;
		m_arrays[i].stride			= 0;
		m_arrays[i].type			= GL_FLOAT;
		m_arrays[i].normalized		= false;
		m_arrays[i].integer			= false;
		m_arrays[i].divisor			= 0;
		m_arrays[i].bufferDeleted	= false;
		m_arrays[i].bufferBinding	= DE_NULL;
		m_arrays[i].pointer			= DE_NULL;
	}
}